

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

int __thiscall jbcoin::Serializer::add32(Serializer *this,uint32_t i)

{
  size_type sVar1;
  value_type_conflict local_1c;
  value_type_conflict local_1b;
  value_type_conflict local_1a;
  value_type_conflict local_19;
  int local_18;
  uint32_t local_14;
  int ret;
  uint32_t i_local;
  Serializer *this_local;
  
  local_14 = i;
  _ret = this;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mData);
  local_18 = (int)sVar1;
  local_19 = (value_type_conflict)(local_14 >> 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_19);
  local_1a = (value_type_conflict)(local_14 >> 0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_1a);
  local_1b = (value_type_conflict)(local_14 >> 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_1b);
  local_1c = (value_type_conflict)local_14;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->mData,&local_1c);
  return local_18;
}

Assistant:

int Serializer::add32 (std::uint32_t i)
{
    int ret = mData.size ();
    mData.push_back (static_cast<unsigned char> (i >> 24));
    mData.push_back (static_cast<unsigned char> ((i >> 16) & 0xff));
    mData.push_back (static_cast<unsigned char> ((i >> 8) & 0xff));
    mData.push_back (static_cast<unsigned char> (i & 0xff));
    return ret;
}